

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSAtom js_atom_concat_str(JSContext *ctx,JSAtom name,char *str1)

{
  JSAtom JVar1;
  char *ptr;
  size_t __n;
  char *str;
  JSValue JVar2;
  size_t len;
  size_t local_40;
  JSValueUnion local_38;
  
  JVar2 = JS_AtomToString(ctx,name);
  local_38 = JVar2.u;
  if ((int)JVar2.tag == 6) {
    return 0;
  }
  ptr = JS_ToCStringLen(ctx,&local_40,JVar2);
  if (ptr != (char *)0x0) {
    __n = strlen(str1);
    str = (char *)js_malloc(ctx,__n + local_40 + 1);
    if (str != (char *)0x0) {
      memcpy(str,ptr,local_40);
      memcpy(str + local_40,str1,__n);
      str[__n + local_40] = '\0';
      JVar1 = JS_NewAtomLen(ctx,str,__n + local_40);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,str);
      JS_FreeCString(ctx,ptr);
      goto LAB_0014dd56;
    }
  }
  JS_FreeCString(ctx,ptr);
  JVar1 = 0;
LAB_0014dd56:
  JVar2.u.float64 = local_38.float64;
  JS_FreeValue(ctx,JVar2);
  return JVar1;
}

Assistant:

static JSAtom js_atom_concat_str(JSContext *ctx, JSAtom name, const char *str1)
{
    JSValue str;
    JSAtom atom;
    const char *cstr;
    char *cstr2;
    size_t len, len1;
    
    str = JS_AtomToString(ctx, name);
    if (JS_IsException(str))
        return JS_ATOM_NULL;
    cstr = JS_ToCStringLen(ctx, &len, str);
    if (!cstr)
        goto fail;
    len1 = strlen(str1);
    cstr2 = js_malloc(ctx, len + len1 + 1);
    if (!cstr2)
        goto fail;
    memcpy(cstr2, cstr, len);
    memcpy(cstr2 + len, str1, len1);
    cstr2[len + len1] = '\0';
    atom = JS_NewAtomLen(ctx, cstr2, len + len1);
    js_free(ctx, cstr2);
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return atom;
 fail:
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return JS_ATOM_NULL;
}